

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O2

void testOpenDeep(string *tempdir)

{
  int channelCount;
  Compression compression;
  int iVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined8 extraout_RAX;
  char *func;
  long lVar5;
  string fn;
  exr_context_t f;
  undefined8 local_b8;
  code *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  DeepScanLineInputFile file;
  
  std::__cxx11::string::string((string *)&fn,(string *)tempdir);
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_58 = 0;
  local_b8 = 0x68;
  uStack_60 = 0xbf800000fffffffe;
  local_b0 = anon_unknown.dwarf_3813e::err_cb;
  std::__cxx11::string::append((char *)&fn);
  lVar2 = 0;
  do {
    if (lVar2 == 3) {
      remove(fn._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&fn);
      return;
    }
    func = "\x01";
    channelCount = (&DAT_00317d90)[lVar2];
    for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
      compression = *(Compression *)((long)&DAT_00317da0 + lVar5);
      anon_unknown.dwarf_3813e::generateRandomScanFile(&fn,channelCount,compression);
      Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile(&file,fn._M_dataplus._M_p,8);
      Imf_3_4::DeepScanLineInputFile::~DeepScanLineInputFile(&file);
      iVar1 = exr_start_read(&f,fn._M_dataplus._M_p,&local_b8);
      if (iVar1 != 0) {
LAB_00116f13:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x190,0x317b22,func);
        std::__cxx11::string::~string((string *)&fn);
        _Unwind_Resume(extraout_RAX);
      }
      exr_finish(&f);
      anon_unknown.dwarf_3813e::generateRandomTileFile(&fn,channelCount,compression);
      iVar1 = exr_start_read(&f,fn._M_dataplus._M_p,&local_b8);
      if (iVar1 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x193,0x317b22,func);
        goto LAB_00116f13;
      }
      exr_finish(&f);
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void
testOpenDeep (const std::string& tempdir)
{
    std::string fn = tempdir;

    exr_context_t             f;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "randomtempdeep.exr";

    int         chancounts[] = {1, 3, 10, 0};
    Compression comps[] = {NO_COMPRESSION, RLE_COMPRESSION, ZIPS_COMPRESSION};
    for (int c = 0; chancounts[c] > 0; ++c)
    {
        for (int cp = 0; cp < 3; ++cp)
        {
            generateRandomScanFile (fn, chancounts[c], comps[cp]);
            try
            {
                DeepScanLineInputFile file (fn.c_str (), 8);
            }
            catch (std::exception& e)
            {
                std::cerr << "ERROR: c++ unable to open generated deep scane"
                          << e.what () << std::endl;
            }

            EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
            exr_finish (&f);
            generateRandomTileFile (fn, chancounts[c], comps[cp]);
            EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
            exr_finish (&f);
        }
    }
    remove (fn.c_str ());
}